

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::ShowListOverlay
               (string *title,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *items,string *defaultValue,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *cb)

{
  pointer pbVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __type _Var4;
  int width;
  ListOverlay *pLVar5;
  OverlayStack *this;
  long lVar6;
  size_t i;
  ulong uVar7;
  size_t index;
  shared_ptr<cursespp::ListOverlay> dialog;
  shared_ptr<StringListAdapter> stringAdapter;
  value_type current;
  __shared_ptr<StringListAdapter,_(__gnu_cxx::_Lock_policy)2> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  __shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<cursespp::IScrollAdapter,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::
  make_shared<StringListAdapter,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stringAdapter);
  pLVar5 = (ListOverlay *)operator_new(0x360);
  ListOverlay::ListOverlay(pLVar5);
  std::__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            ((__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2> *)&dialog,pLVar5);
  lVar6 = 0;
  index = 0;
  for (uVar7 = 0;
      pbVar1 = (items->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(items->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar7 = uVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&current,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
    _Var4 = std::operator==(&current,defaultValue);
    if (_Var4) {
      index = uVar7;
    }
    std::__cxx11::string::~string((string *)&current);
    lVar6 = lVar6 + 0x20;
  }
  std::__shared_ptr<cursespp::IScrollAdapter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<StringListAdapter,void>
            (local_40,&stringAdapter.
                       super___shared_ptr<StringListAdapter,_(__gnu_cxx::_Lock_policy)2>);
  pLVar5 = ListOverlay::SetAdapter
                     (dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(IScrollAdapterPtr *)local_40);
  pLVar5 = ListOverlay::SetTitle(pLVar5,title);
  width = overlayWidth();
  pLVar5 = ListOverlay::SetWidth(pLVar5,width);
  pLVar5 = ListOverlay::SetSelectedIndex(pLVar5,index);
  pLVar5 = ListOverlay::SetAutoDismiss(pLVar5,true);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&current,cb);
  std::__shared_ptr<StringListAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &stringAdapter.super___shared_ptr<StringListAdapter,_(__gnu_cxx::_Lock_policy)2>);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x30);
  _Var3._M_pi = local_88._M_refcount._M_pi;
  peVar2 = local_88._M_ptr;
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = current.field_2._8_8_;
  if (current.field_2._M_allocated_capacity != 0) {
    *(pointer *)local_78._M_unused._0_8_ = current._M_dataplus._M_p;
    *(size_type *)((long)local_78._M_unused._0_8_ + 8) = current._M_string_length;
    *(size_type *)((long)local_78._M_unused._0_8_ + 0x10) = current.field_2._M_allocated_capacity;
    current.field_2._M_allocated_capacity = 0;
    current.field_2._8_8_ = 0;
  }
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_ptr = (element_type *)0x0;
  *(element_type **)((long)local_78._M_unused._0_8_ + 0x20) = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x28) =
       _Var3._M_pi;
  pcStack_60 = std::
               _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
             ::_M_manager;
  ListOverlay::SetItemSelectedCallback(pLVar5,(ItemSelectedCallback *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  ShowListOverlay(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string,std::function<void(std::__cxx11::string)>)
  ::$_0::~__0((__0 *)&current);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  this = App::Overlays();
  std::__shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            (local_50,&dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>)
  ;
  OverlayStack::Push(this,(ILayoutPtr *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dialog.super___shared_ptr<cursespp::ListOverlay,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stringAdapter.super___shared_ptr<StringListAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SchemaOverlay::ShowListOverlay(
    const std::string& title,
    std::vector<std::string>& items,
    const std::string defaultValue,
    std::function<void(std::string)> cb)
{
    auto stringAdapter = std::make_shared<StringListAdapter>(items);
    std::shared_ptr<ListOverlay> dialog(new ListOverlay());

    size_t index = 0;
    for (size_t i = 0; i < items.size(); i++) {
        auto current = items[i];
        if (current == defaultValue) {
            index = i;
        }
    }

    dialog->SetAdapter(stringAdapter)
        .SetTitle(title)
        .SetWidth(overlayWidth())
        .SetSelectedIndex(index)
        .SetAutoDismiss(true)
        .SetItemSelectedCallback(
            [cb, stringAdapter](ListOverlay* overlay, IScrollAdapterPtr adapter, size_t index) {
                if (cb) {
                    cb(stringAdapter->At(index));
                }
            });

    cursespp::App::Overlays().Push(dialog);
}